

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

float absl::lts_20250127::anon_unknown_0::FloatTraits<float>::Make
                (mantissa_t mantissa,int exponent,bool sign)

{
  float fVar1;
  uint local_1c [2];
  uint32_t flt;
  uint32_t kMantissaMask;
  mantissa_t mStack_c;
  bool sign_local;
  int exponent_local;
  mantissa_t mantissa_local;
  
  local_1c[1] = 0x7fffff;
  local_1c[0] = (uint)sign * -0x80000000;
  flt._3_1_ = sign;
  kMantissaMask = exponent;
  if (mantissa < 0x800000) {
    mStack_c = mantissa;
    if (exponent != -0x95) {
      __assert_fail("exponent == kMinNormalExponent",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/charconv.cc"
                    ,0xe6,
                    "static float absl::lts_20250127::(anonymous namespace)::FloatTraits<float>::Make(mantissa_t, int, bool)"
                   );
    }
  }
  else {
    local_1c[0] = (exponent + 0x96) * 0x800000 + local_1c[0];
    mStack_c = mantissa & 0x7fffff;
  }
  local_1c[0] = mStack_c + local_1c[0];
  fVar1 = bit_cast<float,_unsigned_int,_0>(local_1c);
  return fVar1;
}

Assistant:

static float Make(mantissa_t mantissa, int exponent, bool sign) {
#ifndef ABSL_BIT_PACK_FLOATS
    // Support ldexpf no matter which namespace it's in.  Some platforms
    // incorrectly don't put it in namespace std.
    using namespace std;  // NOLINT
    return sign ? -ldexpf(mantissa, exponent) : ldexpf(mantissa, exponent);
#else
    constexpr uint32_t kMantissaMask =
        (uint32_t{1} << (kTargetMantissaBits - 1)) - 1;
    uint32_t flt = static_cast<uint32_t>(sign) << 31;
    if (mantissa > kMantissaMask) {
      // Normal value.
      // Adjust by 127 for the exponent representation bias, and an additional
      // 23 due to the implied decimal point in the IEEE mantissa
      // representation.
      flt += static_cast<uint32_t>(exponent + 127 + kTargetMantissaBits - 1)
             << 23;
      mantissa &= kMantissaMask;
    } else {
      // subnormal value
      assert(exponent == kMinNormalExponent);
    }
    flt += mantissa;
    return absl::bit_cast<float>(flt);
#endif  // ABSL_BIT_PACK_FLOATS
  }